

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O2

cse_abstract * __thiscall
factory_item<xray_re::se_outfit>::create(factory_item<xray_re::se_outfit> *this)

{
  cse_abstract *this_00;
  
  this_00 = (cse_abstract *)operator_new(0x200);
  xray_re::se_outfit::se_outfit((se_outfit *)this_00);
  (this_00->m_clsid).field_0 = (this->super_factory_item_base).m_clsid.field_0;
  return this_00;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}